

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1533.c
# Opt level: O1

int perform_and_check_connections(CURL *curl,char *description,long expected_connections)

{
  int iVar1;
  char *pcVar2;
  long connections;
  long local_20;
  
  local_20 = 0;
  iVar1 = curl_easy_perform();
  if (iVar1 == 0) {
    iVar1 = curl_easy_getinfo(curl,0x20001a,&local_20);
    if (iVar1 == 0) {
      curl_mfprintf(_stderr,"%s: expected: %ld connections; actual: %ld connections\n",description,
                    expected_connections,local_20);
      return (local_20 == expected_connections) + 0x77;
    }
    pcVar2 = "curl_easy_getinfo() failed\n";
  }
  else {
    pcVar2 = "curl_easy_perform() failed\n";
  }
  curl_mfprintf(_stderr,pcVar2);
  return 0x7e;
}

Assistant:

static int perform_and_check_connections(CURL *curl, const char *description,
                                         long expected_connections)
{
  CURLcode res;
  long connections = 0;

  res = curl_easy_perform(curl);
  if(res != CURLE_OK) {
    fprintf(stderr, "curl_easy_perform() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res = curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &connections);
  if(res != CURLE_OK) {
    fprintf(stderr, "curl_easy_getinfo() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  fprintf(stderr, "%s: expected: %ld connections; actual: %ld connections\n",
          description, expected_connections, connections);

  if(connections != expected_connections) {
    return TEST_ERR_FAILURE;
  }

  return TEST_ERR_SUCCESS;
}